

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O3

void compute_response_layer_switch_Dyy(response_layer *layer,integral_image *iimage)

{
  uint uVar1;
  float *pfVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  int width;
  uint uVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  float *data_4;
  int iVar42;
  float *data;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  float local_158 [2];
  undefined1 *local_150;
  ulong local_148;
  float *local_140;
  bool *local_138;
  ulong local_130;
  long local_128;
  ulong local_120;
  ulong local_118;
  int height;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  bool *local_e0;
  float *local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  int local_b8;
  undefined4 uStack_b4;
  long local_b0;
  int local_a4;
  long local_a0;
  ulong local_98;
  int local_8c;
  ulong uStack_88;
  int data_width;
  int local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  int local_48;
  undefined4 uStack_44;
  ulong local_40;
  ulong local_38;
  
  uVar1 = iimage->height;
  iVar20 = layer->filter_size;
  if (iVar20 <= (int)uVar1) {
    compute_response_layer_Dyy_laplacian_locality_inlined(layer,iimage);
    return;
  }
  uVar7 = iimage->width;
  uVar3 = iVar20 / 3;
  uVar19 = (iVar20 + -1) - (iVar20 + -1 >> 0x1f) >> 1;
  local_c8 = (ulong)uVar19;
  uVar18 = (ulong)uVar3;
  if ((int)uVar1 <= (int)uVar19) {
    local_a4 = layer->height;
    iVar36 = iimage->data_width;
    pfVar2 = iimage->data;
    iVar31 = layer->step;
    lVar41 = (long)iVar31;
    local_140 = layer->response;
    fVar49 = 1.0 / (float)(iVar20 * iVar20);
    local_138 = layer->laplacian;
    local_f8 = uVar18;
    local_128 = lVar41;
    if ((int)uVar3 < (int)uVar7) {
      local_150 = (undefined1 *)local_158;
      lVar39 = (long)local_158 - ((ulong)uVar7 * 4 + 0xf & 0xfffffffffffffff0);
      iVar42 = layer->width * iVar31;
      iVar36 = (uVar1 - 1) * iVar36;
      if (iVar42 - uVar3 == 0 || iVar42 < (int)uVar3) {
        lVar15 = 0;
      }
      else {
        lVar15 = 0;
        do {
          *(float *)(lVar39 + lVar15 * 4) = pfVar2[(int)((uVar3 - 1) + iVar36 + (int)lVar15)];
          lVar15 = lVar15 + lVar41;
        } while (lVar15 < (long)(ulong)(iVar42 - uVar3));
      }
      fVar53 = pfVar2[(int)((uVar7 - 1) + iVar36)];
      if ((int)lVar15 < (int)uVar3) {
        lVar15 = (long)(int)lVar15;
        do {
          *(float *)(lVar39 + lVar15 * 4) = fVar53;
          lVar15 = lVar15 + lVar41;
        } while (lVar15 < (int)uVar3);
      }
      lVar35 = (long)iVar42;
      iVar9 = (int)lVar15;
      if (iVar9 < iVar42) {
        lVar15 = (long)iVar9;
        iVar36 = (iVar36 + iVar9) - uVar3;
        do {
          lVar37 = (long)iVar36;
          iVar36 = iVar36 + iVar31;
          *(float *)(lVar39 + lVar15 * 4) = fVar53 - pfVar2[lVar37];
          lVar15 = lVar15 + lVar41;
        } while (lVar15 < lVar35);
      }
      local_a4 = local_a4 * iVar31;
      if (0 < local_a4) {
        auVar45 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        local_8c = 0;
        uVar1 = iVar20 / 6;
        local_108 = (ulong)(uVar3 * 2);
        local_120 = (ulong)(uVar3 - uVar1);
        local_130 = (ulong)uVar1;
        local_148 = (ulong)-uVar1;
        local_118 = 0;
        uVar29 = iVar20 - (int)local_c8;
        uVar7 = -(int)local_c8;
        local_c8 = (ulong)uVar7;
        uVar19 = -uVar3;
        local_d0 = (ulong)uVar19;
        local_a0 = lVar39;
        local_100 = (ulong)uVar29;
        local_7c = iVar42;
        _height = iimage;
        local_b0 = lVar35;
        do {
          iVar20 = (int)local_118;
          if (0 < iVar42) {
            uVar8 = iVar20 - uVar1;
            uVar23 = iimage->height;
            iVar36 = iimage->data_width;
            pfVar2 = iimage->data;
            uVar34 = uVar8;
            if ((int)uVar23 < (int)uVar8) {
              uVar34 = uVar23;
            }
            iVar31 = (int)uVar18;
            local_70 = (ulong)uVar34;
            uVar6 = uVar8 + iVar31;
            if ((int)uVar23 <= (int)(uVar8 + iVar31)) {
              uVar6 = uVar23;
            }
            uVar30 = (uVar34 - 1) * iVar36;
            local_78 = (ulong)uVar6;
            iVar9 = (uVar6 - 1) * iVar36;
            local_c0 = (ulong)uVar30;
            uVar8 = iVar20 - iVar31;
            _local_b8 = CONCAT44(uStack_b4,iVar9);
            uVar14 = uVar8 + 1;
            if ((int)uVar23 < (int)(uVar8 + 1)) {
              uVar14 = uVar23;
            }
            local_f0 = (ulong)uVar14;
            uVar10 = uVar3 * 2 + uVar8;
            if ((int)uVar23 <= (int)uVar10) {
              uVar10 = uVar23;
            }
            uVar38 = (uVar14 - 1) * iVar36;
            local_e8 = (ulong)uVar10;
            iVar11 = (uVar10 - 1) * iVar36;
            if ((int)uVar23 < (int)uVar8) {
              uVar8 = uVar23;
            }
            local_50 = (ulong)uVar38;
            iVar5 = iimage->width;
            _local_48 = CONCAT44(uStack_44,iVar11);
            local_68 = (ulong)uVar8;
            local_60 = (ulong)uVar23;
            if (iVar20 < (int)uVar23) {
              local_60 = local_118;
            }
            uVar12 = (uVar8 - 1) * iVar36;
            local_40 = (ulong)uVar12;
            iVar27 = (int)local_60;
            uVar13 = (iVar27 + -1) * iVar36;
            local_38 = (ulong)uVar13;
            uVar21 = iVar20 + 1 + iVar31;
            uVar26 = iVar20 + 1U;
            if ((int)uVar23 < (int)(iVar20 + 1U)) {
              uVar26 = uVar23;
            }
            local_58 = (ulong)uVar26;
            if ((int)uVar21 < (int)uVar23) {
              uVar23 = uVar21;
            }
            lVar15 = 0;
            uVar21 = (uVar26 - 1) * iVar36;
            uVar22 = (uVar23 - 1) * iVar36;
            local_98 = (ulong)uVar21;
            local_d8 = local_140 + local_8c;
            uStack_88 = (ulong)uVar22;
            lVar41 = 0;
            local_e0 = local_138 + local_8c;
            do {
              iVar36 = (int)lVar15;
              iVar17 = (int)uVar18 + iVar36;
              fVar50 = 0.0;
              fVar53 = 0.0;
              iVar31 = uVar19 + 1 + iVar36;
              if (iVar5 < iVar31) {
                iVar31 = iVar5;
              }
              if (iVar5 <= iVar17) {
                iVar17 = iVar5;
              }
              if ((0 < (int)uVar34) && (0 < iVar31)) {
                fVar53 = pfVar2[(int)(uVar30 + iVar31 + -1)];
              }
              if ((0 < (int)uVar34) && (0 < iVar17)) {
                fVar50 = pfVar2[(int)(uVar30 + iVar17 + -1)];
              }
              fVar51 = 0.0;
              fVar55 = 0.0;
              if ((0 < (int)uVar6) && (0 < iVar31)) {
                fVar55 = pfVar2[iVar31 + -1 + iVar9];
              }
              if ((0 < (int)uVar6) && (0 < iVar17)) {
                fVar51 = pfVar2[iVar17 + -1 + iVar9];
              }
              fVar54 = 0.0;
              iVar31 = uVar7 + iVar36;
              fVar57 = 0.0;
              if (iVar5 < iVar31) {
                iVar31 = iVar5;
              }
              auVar43 = vmaxss_avx(ZEXT416((uint)(((fVar53 - fVar50) - fVar55) + fVar51)),
                                   ZEXT816(0) << 0x40);
              auVar43 = vfmadd213ss_fma(auVar43,SUB6416(ZEXT464(0xc0400000),0),
                                        ZEXT416(*(uint *)(lVar39 + lVar15 * 4)));
              iVar17 = uVar29 + iVar36;
              if (iVar5 <= iVar17) {
                iVar17 = iVar5;
              }
              if ((0 < (int)uVar14) && (0 < iVar31)) {
                fVar57 = pfVar2[(int)(uVar38 + iVar31 + -1)];
              }
              if ((0 < (int)uVar14) && (0 < iVar17)) {
                fVar54 = pfVar2[(int)(uVar38 + iVar17 + -1)];
              }
              fVar50 = 0.0;
              fVar53 = 0.0;
              if ((0 < (int)uVar10) && (0 < iVar31)) {
                fVar53 = pfVar2[iVar31 + -1 + iVar11];
              }
              if ((0 < (int)uVar10) && (0 < iVar17)) {
                fVar50 = pfVar2[iVar17 + -1 + iVar11];
              }
              fVar55 = 0.0;
              iVar31 = -uVar1 + iVar36;
              iVar17 = (uVar3 - uVar1) + iVar36;
              if (iVar5 < iVar31) {
                iVar31 = iVar5;
              }
              if (iVar5 <= iVar17) {
                iVar17 = iVar5;
              }
              if ((0 < (int)uVar14) && (0 < iVar31)) {
                fVar55 = pfVar2[(int)(uVar38 + iVar31 + -1)];
              }
              fVar51 = 0.0;
              if ((0 < (int)uVar14) && (0 < iVar17)) {
                fVar51 = pfVar2[(int)(uVar38 + iVar17 + -1)];
              }
              fVar58 = 0.0;
              fVar56 = 0.0;
              if ((0 < (int)uVar10) && (0 < iVar31)) {
                fVar56 = pfVar2[iVar31 + -1 + iVar11];
              }
              if ((0 < (int)uVar10) && (0 < iVar17)) {
                fVar58 = pfVar2[iVar17 + -1 + iVar11];
              }
              iVar17 = iVar36 + 1 + (int)uVar18;
              fVar60 = 0.0;
              iVar31 = iVar36 + 1;
              if (iVar5 < iVar36 + 1) {
                iVar31 = iVar5;
              }
              if (iVar5 <= iVar17) {
                iVar17 = iVar5;
              }
              iVar40 = iVar31 + -1;
              auVar48 = vmaxss_avx(ZEXT416((uint)(((fVar57 - fVar54) - fVar53) + fVar50)),
                                   ZEXT816(0) << 0x40);
              auVar46 = vmaxss_avx(ZEXT416((uint)(fVar58 + ((fVar55 - fVar51) - fVar56))),
                                   ZEXT816(0) << 0x40);
              auVar48 = vfmadd132ss_fma(auVar46,auVar48,SUB6416(ZEXT464(0xc0400000),0));
              fVar53 = 0.0;
              if ((0 < (int)uVar8) && (0 < iVar31)) {
                fVar53 = pfVar2[(int)(uVar12 + iVar40)];
              }
              iVar32 = iVar17 + -1;
              if ((0 < (int)uVar8) && (0 < iVar17)) {
                fVar60 = pfVar2[(int)(uVar12 + iVar32)];
              }
              fVar55 = 0.0;
              fVar50 = 0.0;
              if ((0 < iVar27) && (0 < iVar31)) {
                fVar50 = pfVar2[(int)(uVar13 + iVar40)];
              }
              if ((0 < iVar27) && (0 < iVar17)) {
                fVar55 = pfVar2[(int)(uVar13 + iVar32)];
              }
              fVar51 = 0.0;
              iVar25 = uVar19 + iVar36;
              if (iVar5 < (int)(uVar19 + iVar36)) {
                iVar25 = iVar5;
              }
              iVar33 = iVar5;
              if (iVar36 < iVar5) {
                iVar33 = iVar36;
              }
              iVar36 = iVar25 + -1;
              if ((0 < (int)uVar26) && (0 < iVar25)) {
                fVar51 = pfVar2[(int)(uVar21 + iVar36)];
              }
              iVar24 = iVar33 + -1;
              fVar57 = 0.0;
              if ((0 < (int)uVar26) && (0 < iVar33)) {
                fVar57 = pfVar2[(int)(uVar21 + iVar24)];
              }
              fVar56 = 0.0;
              fVar54 = 0.0;
              if ((0 < (int)uVar23) && (0 < iVar25)) {
                fVar54 = pfVar2[(int)(uVar22 + iVar36)];
              }
              if ((0 < (int)uVar23) && (0 < iVar33)) {
                fVar56 = pfVar2[(int)(uVar22 + iVar24)];
              }
              auVar46 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
              in_ZMM16 = ZEXT1664(auVar46);
              if ((0 < (int)uVar8) && (0 < iVar25)) {
                in_ZMM16 = ZEXT464((uint)pfVar2[(int)(uVar12 + iVar36)]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
              in_ZMM17 = ZEXT1664(auVar46);
              if ((0 < (int)uVar8) && (0 < iVar33)) {
                in_ZMM17 = ZEXT464((uint)pfVar2[(int)(uVar12 + iVar24)]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
              in_ZMM18 = ZEXT1664(auVar46);
              auVar46 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
              in_ZMM19 = ZEXT1664(auVar46);
              if ((0 < iVar27) && (0 < iVar25)) {
                in_ZMM19 = ZEXT464((uint)pfVar2[(int)(iVar36 + uVar13)]);
              }
              if ((0 < iVar27) && (0 < iVar33)) {
                in_ZMM18 = ZEXT464((uint)pfVar2[(int)(iVar24 + uVar13)]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
              in_ZMM21 = ZEXT1664(auVar46);
              if ((0 < (int)uVar26) && (0 < iVar31)) {
                in_ZMM21 = ZEXT464((uint)pfVar2[(int)(uVar21 + iVar40)]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
              in_ZMM22 = ZEXT1664(auVar46);
              if ((0 < (int)uVar26) && (0 < iVar17)) {
                in_ZMM22 = ZEXT464((uint)pfVar2[(int)(uVar21 + iVar32)]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
              in_ZMM23 = ZEXT1664(auVar46);
              auVar46 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
              in_ZMM24 = ZEXT1664(auVar46);
              if ((0 < (int)uVar23) && (0 < iVar31)) {
                in_ZMM24 = ZEXT464((uint)pfVar2[(int)(iVar40 + uVar22)]);
              }
              if ((0 < (int)uVar23) && (0 < iVar17)) {
                in_ZMM23 = ZEXT464((uint)pfVar2[(int)(iVar32 + uVar22)]);
              }
              fVar58 = fVar49 * auVar43._0_4_;
              fVar59 = fVar49 * auVar48._0_4_;
              auVar43 = vmaxss_avx(ZEXT416((uint)(fVar55 + ((fVar53 - fVar60) - fVar50))),
                                   ZEXT816(0) << 0x40);
              auVar48 = vmaxss_avx(ZEXT416((uint)(fVar56 + ((fVar51 - fVar57) - fVar54))),
                                   ZEXT816(0) << 0x40);
              auVar46 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
              auVar46 = vsubss_avx512f(auVar46,in_ZMM19._0_16_);
              auVar46 = vaddss_avx512f(auVar46,in_ZMM18._0_16_);
              auVar47 = vmaxss_avx512f(auVar46,auVar45);
              auVar46 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
              auVar46 = vsubss_avx512f(auVar46,in_ZMM24._0_16_);
              auVar46 = vaddss_avx512f(auVar46,in_ZMM23._0_16_);
              auVar46 = vmaxss_avx(auVar46,ZEXT816(0) << 0x40);
              fVar53 = fVar49 * (((auVar43._0_4_ + auVar48._0_4_) - auVar47._0_4_) - auVar46._0_4_);
              auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar53 * -0.81)),
                                        ZEXT416((uint)fVar59),ZEXT416((uint)fVar58));
              (local_140 + local_8c)[lVar41] = auVar43._0_4_;
              (local_138 + local_8c)[lVar41] = 0.0 <= fVar58 + fVar59;
              lVar15 = lVar15 + local_128;
              lVar41 = lVar41 + 1;
              uVar18 = local_f8;
            } while (lVar15 < lVar35);
            local_8c = local_8c + (int)lVar41;
            lVar41 = local_128;
          }
          uVar23 = iVar20 + (int)lVar41;
          local_118 = (ulong)uVar23;
        } while ((int)uVar23 < local_a4);
      }
    }
    else {
      iVar42 = layer->width * iVar31;
      fVar53 = pfVar2[(int)((uVar1 - 1) * iVar36 + -1 + uVar7)];
      uVar29 = iVar20 / 6;
      if (iVar42 - uVar29 == 0 || iVar42 < (int)uVar29) {
        iVar9 = 0;
        uVar18 = 0;
      }
      else {
        auVar45 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar45);
        auVar43 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        in_ZMM21 = ZEXT1664(auVar43);
        iVar9 = 0;
        uVar18 = 0;
        do {
          iVar11 = (int)uVar18;
          auVar48 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[(int)((uVar3 + ~uVar29 + iVar11) * iVar36 +
                                                              (uVar7 - 1))]),
                                    SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar53));
          if (0 < iVar42) {
            uVar23 = iVar11 - uVar3;
            fVar50 = fVar49 * auVar48._0_4_;
            uVar34 = uVar23 + 1;
            if ((int)uVar1 < (int)(uVar23 + 1)) {
              uVar34 = uVar1;
            }
            uVar8 = uVar3 * 2 + uVar23;
            if ((int)uVar1 <= (int)uVar8) {
              uVar8 = uVar1;
            }
            iVar27 = (uVar34 - 1) * iVar36;
            iVar5 = (uVar8 - 1) * iVar36;
            if ((int)uVar1 < (int)uVar23) {
              uVar23 = uVar1;
            }
            uVar4 = (ulong)uVar1;
            if (iVar11 < (int)uVar1) {
              uVar4 = uVar18;
            }
            iVar40 = (int)uVar4;
            iVar17 = (uVar23 - 1) * iVar36;
            iVar32 = (iVar40 + -1) * iVar36;
            uVar6 = uVar3 + 1 + iVar11;
            uVar14 = iVar11 + 1U;
            if ((int)uVar1 < (int)(iVar11 + 1U)) {
              uVar14 = uVar1;
            }
            if ((int)uVar1 <= (int)uVar6) {
              uVar6 = uVar1;
            }
            lVar39 = 0;
            iVar11 = (uVar14 - 1) * iVar36;
            iVar25 = (uVar6 - 1) * iVar36;
            uVar30 = 0;
            do {
              fVar51 = 0.0;
              fVar55 = 0.0;
              uVar10 = uVar30 - uVar19;
              if ((int)uVar7 < (int)(uVar30 - uVar19)) {
                uVar10 = uVar7;
              }
              uVar38 = (iVar20 - uVar19) + uVar30;
              if ((int)uVar7 <= (int)uVar38) {
                uVar38 = uVar7;
              }
              if ((0 < (int)uVar34) && (0 < (int)uVar10)) {
                fVar55 = pfVar2[(int)(iVar27 + (uVar10 - 1))];
              }
              if ((0 < (int)uVar34) && (0 < (int)uVar38)) {
                fVar51 = pfVar2[(int)(iVar27 + (uVar38 - 1))];
              }
              fVar54 = 0.0;
              fVar57 = 0.0;
              if ((0 < (int)uVar8) && (0 < (int)uVar10)) {
                fVar57 = pfVar2[(int)((uVar10 - 1) + iVar5)];
              }
              if ((0 < (int)uVar8) && (0 < (int)uVar38)) {
                fVar54 = pfVar2[(int)((uVar38 - 1) + iVar5)];
              }
              fVar56 = 0.0;
              uVar10 = uVar30 - uVar29;
              if ((int)uVar7 < (int)(uVar30 - uVar29)) {
                uVar10 = uVar7;
              }
              uVar38 = (uVar3 - uVar29) + uVar30;
              if ((int)uVar7 <= (int)uVar38) {
                uVar38 = uVar7;
              }
              if ((0 < (int)uVar34) && (0 < (int)uVar10)) {
                fVar56 = pfVar2[(int)(iVar27 + (uVar10 - 1))];
              }
              fVar58 = 0.0;
              if ((0 < (int)uVar34) && (0 < (int)uVar38)) {
                fVar58 = pfVar2[(int)((uVar38 - 1) + iVar27)];
              }
              fVar59 = 0.0;
              fVar60 = 0.0;
              if ((0 < (int)uVar8) && (0 < (int)uVar10)) {
                fVar60 = pfVar2[(int)((uVar10 - 1) + iVar5)];
              }
              if ((0 < (int)uVar8) && (0 < (int)uVar38)) {
                fVar59 = pfVar2[(int)((uVar38 - 1) + iVar5)];
              }
              uVar38 = uVar30 + 1 + uVar3;
              fVar52 = 0.0;
              uVar10 = uVar30 + 1;
              if ((int)uVar7 < (int)(uVar30 + 1)) {
                uVar10 = uVar7;
              }
              if ((int)uVar7 <= (int)uVar38) {
                uVar38 = uVar7;
              }
              iVar33 = uVar10 - 1;
              auVar48 = vmaxss_avx(ZEXT416((uint)(fVar54 + ((fVar55 - fVar51) - fVar57))),
                                   ZEXT816(0) << 0x40);
              auVar46 = vmaxss_avx(ZEXT416((uint)(fVar59 + ((fVar56 - fVar58) - fVar60))),
                                   ZEXT816(0) << 0x40);
              auVar48 = vfmadd132ss_fma(auVar46,auVar48,SUB6416(ZEXT464(0xc0400000),0));
              fVar55 = 0.0;
              if ((0 < (int)uVar23) && (0 < (int)uVar10)) {
                fVar55 = pfVar2[iVar17 + iVar33];
              }
              iVar24 = uVar38 - 1;
              if ((0 < (int)uVar23) && (0 < (int)uVar38)) {
                fVar52 = pfVar2[iVar17 + iVar24];
              }
              fVar57 = 0.0;
              fVar51 = 0.0;
              if ((0 < iVar40) && (0 < (int)uVar10)) {
                fVar51 = pfVar2[iVar32 + iVar33];
              }
              if ((0 < iVar40) && (0 < (int)uVar38)) {
                fVar57 = pfVar2[iVar32 + iVar24];
              }
              fVar54 = 0.0;
              uVar26 = uVar30 - uVar3;
              if ((int)uVar7 < (int)(uVar30 - uVar3)) {
                uVar26 = uVar7;
              }
              uVar12 = uVar7;
              if ((int)uVar30 < (int)uVar7) {
                uVar12 = uVar30;
              }
              iVar28 = uVar26 - 1;
              if ((0 < (int)uVar14) && (0 < (int)uVar26)) {
                fVar54 = pfVar2[iVar11 + iVar28];
              }
              iVar16 = uVar12 - 1;
              fVar56 = 0.0;
              if ((0 < (int)uVar14) && (0 < (int)uVar12)) {
                fVar56 = pfVar2[iVar11 + iVar16];
              }
              fVar60 = 0.0;
              fVar58 = 0.0;
              if ((0 < (int)uVar6) && (0 < (int)uVar26)) {
                fVar58 = pfVar2[iVar25 + iVar28];
              }
              if ((0 < (int)uVar6) && (0 < (int)uVar12)) {
                fVar60 = pfVar2[iVar25 + iVar16];
              }
              auVar46 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
              in_ZMM17 = ZEXT1664(auVar46);
              if ((0 < (int)uVar23) && (0 < (int)uVar26)) {
                in_ZMM17 = ZEXT464((uint)pfVar2[iVar17 + iVar28]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
              in_ZMM18 = ZEXT1664(auVar46);
              if ((0 < (int)uVar23) && (0 < (int)uVar12)) {
                in_ZMM18 = ZEXT464((uint)pfVar2[iVar17 + iVar16]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
              in_ZMM19 = ZEXT1664(auVar46);
              auVar46 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
              in_ZMM20 = ZEXT1664(auVar46);
              if ((0 < iVar40) && (0 < (int)uVar26)) {
                in_ZMM20 = ZEXT464((uint)pfVar2[iVar28 + iVar32]);
              }
              if ((0 < iVar40) && (0 < (int)uVar12)) {
                in_ZMM19 = ZEXT464((uint)pfVar2[iVar16 + iVar32]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
              in_ZMM22 = ZEXT1664(auVar46);
              if ((0 < (int)uVar14) && (0 < (int)uVar10)) {
                in_ZMM22 = ZEXT464((uint)pfVar2[iVar11 + iVar33]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
              in_ZMM23 = ZEXT1664(auVar46);
              if ((0 < (int)uVar14) && (0 < (int)uVar38)) {
                in_ZMM23 = ZEXT464((uint)pfVar2[iVar11 + iVar24]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
              in_ZMM24 = ZEXT1664(auVar46);
              auVar46 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
              in_ZMM25 = ZEXT1664(auVar46);
              if ((0 < (int)uVar6) && (0 < (int)uVar10)) {
                in_ZMM25 = ZEXT464((uint)pfVar2[iVar33 + iVar25]);
              }
              if ((0 < (int)uVar6) && (0 < (int)uVar38)) {
                in_ZMM24 = ZEXT464((uint)pfVar2[iVar24 + iVar25]);
              }
              fVar59 = fVar49 * auVar48._0_4_;
              auVar48 = vmaxss_avx(ZEXT416((uint)(fVar57 + ((fVar55 - fVar52) - fVar51))),
                                   ZEXT816(0) << 0x40);
              auVar47 = vmaxss_avx512f(ZEXT416((uint)(((fVar54 - fVar56) - fVar58) + fVar60)),
                                       auVar45);
              auVar46 = vsubss_avx512f(in_ZMM17._0_16_,in_ZMM18._0_16_);
              auVar46 = vsubss_avx512f(auVar46,in_ZMM20._0_16_);
              auVar46 = vaddss_avx512f(auVar46,in_ZMM19._0_16_);
              auVar44 = vmaxss_avx512f(auVar46,auVar43);
              auVar46 = vsubss_avx512f(in_ZMM22._0_16_,in_ZMM23._0_16_);
              auVar46 = vsubss_avx512f(auVar46,in_ZMM25._0_16_);
              auVar46 = vaddss_avx512f(auVar46,in_ZMM24._0_16_);
              auVar46 = vmaxss_avx(auVar46,ZEXT816(0) << 0x40);
              fVar55 = fVar49 * (((auVar47._0_4_ + auVar48._0_4_) - auVar44._0_4_) - auVar46._0_4_);
              auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar55 * -0.81 * fVar55)),
                                        ZEXT416((uint)fVar59),ZEXT416((uint)fVar50));
              local_140[iVar9 + lVar39] = auVar48._0_4_;
              local_138[lVar39 + iVar9] = 0.0 <= fVar50 + fVar59;
              uVar30 = uVar30 + iVar31;
              lVar39 = lVar39 + 1;
            } while ((int)uVar30 < iVar42);
            iVar9 = iVar9 + (int)lVar39;
          }
          uVar18 = uVar18 + lVar41;
        } while ((long)uVar18 < (long)(ulong)(iVar42 - uVar29));
      }
      auVar43 = in_ZMM22._0_16_;
      auVar45 = in_ZMM17._0_16_;
      fVar53 = fVar53 * -2.0;
      uVar23 = (uint)uVar18;
      if ((int)uVar23 <= (int)uVar29) {
        fVar50 = fVar49 * fVar53;
        auVar48 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar48);
        auVar46 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        in_ZMM21 = ZEXT1664(auVar46);
        do {
          uVar23 = (uint)uVar18;
          if (0 < iVar42) {
            uVar6 = uVar23 - uVar3;
            uVar34 = uVar23 + 1 + uVar3;
            uVar8 = uVar6 + 1;
            if ((int)uVar1 < (int)(uVar6 + 1)) {
              uVar8 = uVar1;
            }
            uVar14 = uVar3 * 2 + uVar6;
            if ((int)uVar1 <= (int)uVar14) {
              uVar14 = uVar1;
            }
            iVar5 = (uVar8 - 1) * iVar36;
            iVar11 = (uVar14 - 1) * iVar36;
            if ((int)uVar1 < (int)uVar6) {
              uVar6 = uVar1;
            }
            uVar30 = uVar1;
            if ((int)uVar23 < (int)uVar1) {
              uVar30 = uVar23;
            }
            iVar27 = (uVar6 - 1) * iVar36;
            iVar17 = (uVar30 - 1) * iVar36;
            uVar10 = uVar23 + 1;
            if ((int)uVar1 < (int)(uVar23 + 1)) {
              uVar10 = uVar1;
            }
            if ((int)uVar1 <= (int)uVar34) {
              uVar34 = uVar1;
            }
            lVar39 = 0;
            iVar40 = (uVar10 - 1) * iVar36;
            iVar32 = (uVar34 - 1) * iVar36;
            uVar38 = 0;
            do {
              fVar51 = 0.0;
              fVar55 = 0.0;
              uVar26 = uVar38 - uVar19;
              if ((int)uVar7 < (int)(uVar38 - uVar19)) {
                uVar26 = uVar7;
              }
              uVar12 = (iVar20 - uVar19) + uVar38;
              if ((int)uVar7 <= (int)uVar12) {
                uVar12 = uVar7;
              }
              if ((0 < (int)uVar8) && (0 < (int)uVar26)) {
                fVar55 = pfVar2[(int)(iVar5 + (uVar26 - 1))];
              }
              if ((0 < (int)uVar8) && (0 < (int)uVar12)) {
                fVar51 = pfVar2[(int)(iVar5 + (uVar12 - 1))];
              }
              fVar54 = 0.0;
              fVar57 = 0.0;
              if ((0 < (int)uVar14) && (0 < (int)uVar26)) {
                fVar57 = pfVar2[(int)((uVar26 - 1) + iVar11)];
              }
              if ((0 < (int)uVar14) && (0 < (int)uVar12)) {
                fVar54 = pfVar2[(int)((uVar12 - 1) + iVar11)];
              }
              fVar56 = 0.0;
              uVar26 = uVar38 - uVar29;
              if ((int)uVar7 < (int)(uVar38 - uVar29)) {
                uVar26 = uVar7;
              }
              uVar12 = (uVar3 - uVar29) + uVar38;
              if ((int)uVar7 <= (int)uVar12) {
                uVar12 = uVar7;
              }
              if ((0 < (int)uVar8) && (0 < (int)uVar26)) {
                fVar56 = pfVar2[(int)(iVar5 + (uVar26 - 1))];
              }
              fVar58 = 0.0;
              if ((0 < (int)uVar8) && (0 < (int)uVar12)) {
                fVar58 = pfVar2[(int)((uVar12 - 1) + iVar5)];
              }
              fVar59 = 0.0;
              fVar60 = 0.0;
              if ((0 < (int)uVar14) && (0 < (int)uVar26)) {
                fVar60 = pfVar2[(int)((uVar26 - 1) + iVar11)];
              }
              if ((0 < (int)uVar14) && (0 < (int)uVar12)) {
                fVar59 = pfVar2[(int)((uVar12 - 1) + iVar11)];
              }
              uVar12 = uVar38 + 1 + uVar3;
              fVar52 = 0.0;
              uVar26 = uVar38 + 1;
              if ((int)uVar7 < (int)(uVar38 + 1)) {
                uVar26 = uVar7;
              }
              if ((int)uVar7 <= (int)uVar12) {
                uVar12 = uVar7;
              }
              iVar25 = uVar26 - 1;
              auVar45 = vmaxss_avx(ZEXT416((uint)(fVar54 + ((fVar55 - fVar51) - fVar57))),
                                   ZEXT816(0) << 0x40);
              auVar43 = vmaxss_avx(ZEXT416((uint)(fVar59 + ((fVar56 - fVar58) - fVar60))),
                                   ZEXT816(0) << 0x40);
              auVar45 = vfmadd132ss_fma(auVar43,auVar45,SUB6416(ZEXT464(0xc0400000),0));
              fVar55 = 0.0;
              if ((0 < (int)uVar6) && (0 < (int)uVar26)) {
                fVar55 = pfVar2[iVar27 + iVar25];
              }
              iVar33 = uVar12 - 1;
              if ((0 < (int)uVar6) && (0 < (int)uVar12)) {
                fVar52 = pfVar2[iVar27 + iVar33];
              }
              fVar57 = 0.0;
              fVar51 = 0.0;
              if ((0 < (int)uVar30) && (0 < (int)uVar26)) {
                fVar51 = pfVar2[iVar17 + iVar25];
              }
              if ((0 < (int)uVar30) && (0 < (int)uVar12)) {
                fVar57 = pfVar2[iVar17 + iVar33];
              }
              fVar54 = 0.0;
              uVar13 = uVar38 - uVar3;
              if ((int)uVar7 < (int)(uVar38 - uVar3)) {
                uVar13 = uVar7;
              }
              uVar21 = uVar7;
              if ((int)uVar38 < (int)uVar7) {
                uVar21 = uVar38;
              }
              iVar24 = uVar13 - 1;
              if ((0 < (int)uVar10) && (0 < (int)uVar13)) {
                fVar54 = pfVar2[iVar24 + iVar40];
              }
              iVar28 = uVar21 - 1;
              fVar56 = 0.0;
              if ((0 < (int)uVar10) && (0 < (int)uVar21)) {
                fVar56 = pfVar2[iVar40 + iVar28];
              }
              fVar60 = 0.0;
              fVar58 = 0.0;
              if ((0 < (int)uVar34) && (0 < (int)uVar13)) {
                fVar58 = pfVar2[iVar32 + iVar24];
              }
              if ((0 < (int)uVar34) && (0 < (int)uVar21)) {
                fVar60 = pfVar2[iVar32 + iVar28];
              }
              auVar43 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
              in_ZMM17 = ZEXT1664(auVar43);
              if ((0 < (int)uVar6) && (0 < (int)uVar13)) {
                in_ZMM17 = ZEXT464((uint)pfVar2[iVar27 + iVar24]);
              }
              auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
              in_ZMM18 = ZEXT1664(auVar43);
              if ((0 < (int)uVar6) && (0 < (int)uVar21)) {
                in_ZMM18 = ZEXT464((uint)pfVar2[iVar27 + iVar28]);
              }
              auVar43 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
              in_ZMM19 = ZEXT1664(auVar43);
              auVar43 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
              in_ZMM20 = ZEXT1664(auVar43);
              if ((0 < (int)uVar30) && (0 < (int)uVar13)) {
                in_ZMM20 = ZEXT464((uint)pfVar2[iVar24 + iVar17]);
              }
              if ((0 < (int)uVar30) && (0 < (int)uVar21)) {
                in_ZMM19 = ZEXT464((uint)pfVar2[iVar28 + iVar17]);
              }
              auVar43 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
              in_ZMM22 = ZEXT1664(auVar43);
              if ((0 < (int)uVar10) && (0 < (int)uVar26)) {
                in_ZMM22 = ZEXT464((uint)pfVar2[iVar40 + iVar25]);
              }
              auVar43 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
              in_ZMM23 = ZEXT1664(auVar43);
              if ((0 < (int)uVar10) && (0 < (int)uVar12)) {
                in_ZMM23 = ZEXT464((uint)pfVar2[iVar40 + iVar33]);
              }
              auVar43 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
              in_ZMM24 = ZEXT1664(auVar43);
              auVar43 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
              in_ZMM25 = ZEXT1664(auVar43);
              if ((0 < (int)uVar34) && (0 < (int)uVar26)) {
                in_ZMM25 = ZEXT464((uint)pfVar2[iVar25 + iVar32]);
              }
              if ((0 < (int)uVar34) && (0 < (int)uVar12)) {
                in_ZMM24 = ZEXT464((uint)pfVar2[iVar33 + iVar32]);
              }
              fVar59 = fVar49 * auVar45._0_4_;
              auVar45 = vmaxss_avx(ZEXT416((uint)(fVar57 + ((fVar55 - fVar52) - fVar51))),
                                   ZEXT816(0) << 0x40);
              auVar47 = vmaxss_avx512f(ZEXT416((uint)(((fVar54 - fVar56) - fVar58) + fVar60)),
                                       auVar48);
              auVar43 = vsubss_avx512f(in_ZMM17._0_16_,in_ZMM18._0_16_);
              auVar43 = vsubss_avx512f(auVar43,in_ZMM20._0_16_);
              auVar43 = vaddss_avx512f(auVar43,in_ZMM19._0_16_);
              auVar44 = vmaxss_avx512f(auVar43,auVar46);
              auVar43 = vsubss_avx512f(in_ZMM22._0_16_,in_ZMM23._0_16_);
              auVar43 = vsubss_avx512f(auVar43,in_ZMM25._0_16_);
              auVar43 = vaddss_avx512f(auVar43,in_ZMM24._0_16_);
              auVar43 = vmaxss_avx(auVar43,ZEXT816(0) << 0x40);
              fVar55 = fVar49 * (((auVar47._0_4_ + auVar45._0_4_) - auVar44._0_4_) - auVar43._0_4_);
              auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar55 * -0.81 * fVar55)),
                                        ZEXT416((uint)fVar59),ZEXT416((uint)fVar50));
              local_140[iVar9 + lVar39] = auVar45._0_4_;
              local_138[lVar39 + iVar9] = 0.0 <= fVar50 + fVar59;
              uVar38 = uVar38 + iVar31;
              lVar39 = lVar39 + 1;
            } while ((int)uVar38 < iVar42);
            iVar9 = iVar9 + (int)lVar39;
          }
          auVar43 = in_ZMM22._0_16_;
          auVar45 = in_ZMM17._0_16_;
          uVar23 = uVar23 + iVar31;
          uVar18 = (ulong)uVar23;
        } while ((int)uVar23 <= (int)uVar29);
      }
      if ((int)uVar23 < local_a4 * iVar31) {
        auVar45 = vxorps_avx512vl(auVar45,auVar45);
        auVar43 = vxorps_avx512vl(auVar43,auVar43);
        uVar18 = (ulong)(int)uVar23;
        do {
          iVar11 = (int)uVar18;
          auVar48 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[(int)((iVar11 + ~uVar29) * iVar36 +
                                                              (uVar7 - 1))]),
                                    SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar53));
          if (0 < iVar42) {
            uVar23 = iVar11 - uVar3;
            fVar50 = fVar49 * auVar48._0_4_;
            uVar34 = uVar23 + 1;
            if ((int)uVar1 < (int)(uVar23 + 1)) {
              uVar34 = uVar1;
            }
            uVar8 = uVar3 * 2 + uVar23;
            if ((int)uVar1 <= (int)uVar8) {
              uVar8 = uVar1;
            }
            iVar27 = (uVar34 - 1) * iVar36;
            iVar5 = (uVar8 - 1) * iVar36;
            if ((int)uVar1 < (int)uVar23) {
              uVar23 = uVar1;
            }
            uVar4 = (ulong)uVar1;
            if (iVar11 < (int)uVar1) {
              uVar4 = uVar18;
            }
            iVar40 = (int)uVar4;
            iVar17 = (uVar23 - 1) * iVar36;
            iVar32 = (iVar40 + -1) * iVar36;
            uVar6 = uVar3 + 1 + iVar11;
            uVar14 = iVar11 + 1U;
            if ((int)uVar1 < (int)(iVar11 + 1U)) {
              uVar14 = uVar1;
            }
            if ((int)uVar1 <= (int)uVar6) {
              uVar6 = uVar1;
            }
            iVar11 = (uVar14 - 1) * iVar36;
            lVar39 = 0;
            iVar25 = (uVar6 - 1) * iVar36;
            uVar30 = 0;
            do {
              fVar51 = 0.0;
              fVar55 = 0.0;
              uVar10 = uVar30 - uVar19;
              if ((int)uVar7 < (int)(uVar30 - uVar19)) {
                uVar10 = uVar7;
              }
              uVar38 = (iVar20 - uVar19) + uVar30;
              if ((int)uVar7 <= (int)uVar38) {
                uVar38 = uVar7;
              }
              if ((0 < (int)uVar34) && (0 < (int)uVar10)) {
                fVar55 = pfVar2[(int)(iVar27 + (uVar10 - 1))];
              }
              if ((0 < (int)uVar34) && (0 < (int)uVar38)) {
                fVar51 = pfVar2[(int)(iVar27 + (uVar38 - 1))];
              }
              fVar54 = 0.0;
              fVar57 = 0.0;
              if ((0 < (int)uVar8) && (0 < (int)uVar10)) {
                fVar57 = pfVar2[(int)((uVar10 - 1) + iVar5)];
              }
              if ((0 < (int)uVar8) && (0 < (int)uVar38)) {
                fVar54 = pfVar2[(int)((uVar38 - 1) + iVar5)];
              }
              fVar56 = 0.0;
              uVar10 = uVar30 - uVar29;
              if ((int)uVar7 < (int)(uVar30 - uVar29)) {
                uVar10 = uVar7;
              }
              uVar38 = (uVar3 - uVar29) + uVar30;
              if ((int)uVar7 <= (int)uVar38) {
                uVar38 = uVar7;
              }
              if ((0 < (int)uVar34) && (0 < (int)uVar10)) {
                fVar56 = pfVar2[(int)(iVar27 + (uVar10 - 1))];
              }
              fVar58 = 0.0;
              if ((0 < (int)uVar34) && (0 < (int)uVar38)) {
                fVar58 = pfVar2[(int)((uVar38 - 1) + iVar27)];
              }
              fVar59 = 0.0;
              fVar60 = 0.0;
              if ((0 < (int)uVar8) && (0 < (int)uVar10)) {
                fVar60 = pfVar2[(int)((uVar10 - 1) + iVar5)];
              }
              if ((0 < (int)uVar8) && (0 < (int)uVar38)) {
                fVar59 = pfVar2[(int)((uVar38 - 1) + iVar5)];
              }
              uVar38 = uVar30 + 1 + uVar3;
              fVar52 = 0.0;
              uVar10 = uVar30 + 1;
              if ((int)uVar7 < (int)(uVar30 + 1)) {
                uVar10 = uVar7;
              }
              if ((int)uVar7 <= (int)uVar38) {
                uVar38 = uVar7;
              }
              iVar33 = uVar10 - 1;
              auVar48 = vmaxss_avx(ZEXT416((uint)(fVar54 + ((fVar55 - fVar51) - fVar57))),
                                   ZEXT816(0) << 0x40);
              auVar46 = vmaxss_avx(ZEXT416((uint)(fVar59 + ((fVar56 - fVar58) - fVar60))),
                                   ZEXT816(0) << 0x40);
              auVar48 = vfmadd132ss_fma(auVar46,auVar48,SUB6416(ZEXT464(0xc0400000),0));
              fVar55 = 0.0;
              if ((0 < (int)uVar23) && (0 < (int)uVar10)) {
                fVar55 = pfVar2[iVar17 + iVar33];
              }
              iVar24 = uVar38 - 1;
              if ((0 < (int)uVar23) && (0 < (int)uVar38)) {
                fVar52 = pfVar2[iVar17 + iVar24];
              }
              fVar57 = 0.0;
              fVar51 = 0.0;
              if ((0 < iVar40) && (0 < (int)uVar10)) {
                fVar51 = pfVar2[iVar32 + iVar33];
              }
              if ((0 < iVar40) && (0 < (int)uVar38)) {
                fVar57 = pfVar2[iVar32 + iVar24];
              }
              fVar54 = 0.0;
              uVar26 = uVar30 - uVar3;
              if ((int)uVar7 < (int)(uVar30 - uVar3)) {
                uVar26 = uVar7;
              }
              uVar12 = uVar7;
              if ((int)uVar30 < (int)uVar7) {
                uVar12 = uVar30;
              }
              iVar28 = uVar26 - 1;
              if ((0 < (int)uVar14) && (0 < (int)uVar26)) {
                fVar54 = pfVar2[iVar28 + iVar11];
              }
              iVar16 = uVar12 - 1;
              fVar56 = 0.0;
              if ((0 < (int)uVar14) && (0 < (int)uVar12)) {
                fVar56 = pfVar2[iVar11 + iVar16];
              }
              fVar58 = 0.0;
              auVar46 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
              in_ZMM16 = ZEXT1664(auVar46);
              if ((0 < (int)uVar6) && (0 < (int)uVar26)) {
                in_ZMM16 = ZEXT464((uint)pfVar2[iVar25 + iVar28]);
              }
              if ((0 < (int)uVar6) && (0 < (int)uVar12)) {
                fVar58 = pfVar2[iVar25 + iVar16];
              }
              auVar46 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
              in_ZMM18 = ZEXT1664(auVar46);
              if ((0 < (int)uVar23) && (0 < (int)uVar26)) {
                in_ZMM18 = ZEXT464((uint)pfVar2[iVar17 + iVar28]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
              in_ZMM19 = ZEXT1664(auVar46);
              if ((0 < (int)uVar23) && (0 < (int)uVar12)) {
                in_ZMM19 = ZEXT464((uint)pfVar2[iVar17 + iVar16]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
              in_ZMM20 = ZEXT1664(auVar46);
              auVar46 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
              in_ZMM21 = ZEXT1664(auVar46);
              if ((0 < iVar40) && (0 < (int)uVar26)) {
                in_ZMM21 = ZEXT464((uint)pfVar2[iVar28 + iVar32]);
              }
              if ((0 < iVar40) && (0 < (int)uVar12)) {
                in_ZMM20 = ZEXT464((uint)pfVar2[iVar16 + iVar32]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
              in_ZMM23 = ZEXT1664(auVar46);
              if ((0 < (int)uVar14) && (0 < (int)uVar10)) {
                in_ZMM23 = ZEXT464((uint)pfVar2[iVar11 + iVar33]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
              in_ZMM24 = ZEXT1664(auVar46);
              if ((0 < (int)uVar14) && (0 < (int)uVar38)) {
                in_ZMM24 = ZEXT464((uint)pfVar2[iVar11 + iVar24]);
              }
              auVar46 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
              in_ZMM25 = ZEXT1664(auVar46);
              auVar46 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
              in_ZMM26 = ZEXT1664(auVar46);
              if ((0 < (int)uVar6) && (0 < (int)uVar10)) {
                in_ZMM26 = ZEXT464((uint)pfVar2[iVar33 + iVar25]);
              }
              if ((0 < (int)uVar6) && (0 < (int)uVar38)) {
                in_ZMM25 = ZEXT464((uint)pfVar2[iVar24 + iVar25]);
              }
              fVar60 = fVar49 * auVar48._0_4_;
              auVar46 = vsubss_avx512f(ZEXT416((uint)(fVar54 - fVar56)),in_ZMM16._0_16_);
              auVar48 = vmaxss_avx(ZEXT416((uint)(((fVar55 - fVar52) - fVar51) + fVar57)),
                                   ZEXT816(0) << 0x40);
              auVar47 = vmaxss_avx512f(ZEXT416((uint)(auVar46._0_4_ + fVar58)),auVar45);
              auVar46 = vsubss_avx512f(in_ZMM18._0_16_,in_ZMM19._0_16_);
              auVar46 = vsubss_avx512f(auVar46,in_ZMM21._0_16_);
              auVar46 = vaddss_avx512f(auVar46,in_ZMM20._0_16_);
              auVar44 = vmaxss_avx512f(auVar46,auVar43);
              auVar46 = vsubss_avx512f(in_ZMM23._0_16_,in_ZMM24._0_16_);
              auVar46 = vsubss_avx512f(auVar46,in_ZMM26._0_16_);
              auVar46 = vaddss_avx512f(auVar46,in_ZMM25._0_16_);
              auVar46 = vmaxss_avx(auVar46,ZEXT816(0) << 0x40);
              fVar55 = (((auVar48._0_4_ + auVar47._0_4_) - auVar44._0_4_) - auVar46._0_4_) * fVar49;
              auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar55 * fVar55 * -0.81)),
                                        ZEXT416((uint)fVar60),ZEXT416((uint)fVar50));
              local_140[iVar9 + lVar39] = auVar48._0_4_;
              local_138[lVar39 + iVar9] = 0.0 <= fVar50 + fVar60;
              uVar30 = uVar30 + iVar31;
              lVar39 = lVar39 + 1;
            } while ((int)uVar30 < iVar42);
            iVar9 = iVar9 + (int)lVar39;
          }
          uVar18 = uVar18 + lVar41;
        } while ((long)uVar18 < (long)(local_a4 * iVar31));
      }
    }
    return;
  }
  if (SBORROW4(uVar7,uVar3 * 2) == (int)(uVar7 + uVar3 * -2) < 0) {
    height_greater_border_width_greater_double_lobe_Dyy_inlined(layer,iimage);
    return;
  }
  height_greater_border_width_less_double_lobe_Dyy_inlined(layer,iimage);
  return;
}

Assistant:

void compute_response_layer_switch_Dyy(struct response_layer *layer, struct integral_image *iimage) {
    /*
        optimizations:
            - Case distinction to calculate Dyy filter more optimaly
            - Combination of different functions and uses them depending on case
    */

    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int i, j, k, k0;
    int x = 0;
    int y = 0;

    // 1. Case The filter is smaller than the image
    if (filter_size <= iheight) {
        // Split the image into 9 cases - corners, borders and middle part.
        compute_response_layer_Dyy_laplacian_locality_inlined(layer, iimage);

    } else {
        // 2. Case The filter is taller than the image
        if (iheight > border) {

            // 2.1. D is sometimes outside the image.
            // everytime all corners are outside, we just use row values above
            if (iwidth > 2 * lobe - 1) {
                height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);
            } else {
                height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);
            }

        } else {
            // Case 2.2 D is always outside the image.
            // Half the filter height is longer than the image.  // TODO this makes no sense
            if (iwidth <= lobe) {
                // Case 2.2a the filter is longer and wider than the image.

                // D is right bottom corner or to the right (possibly below image)
                // A, B, C = 0
                D0 = data[(iheight-1) * data_width + (iwidth-1)];

                // Differentiate 2 cases
                // for the negative part:
                // 1.
                // is negative / inner part of Dyy box filter completely too big
                // i.e. is inner D on the right bottom corner or even bigger (to the right or below)
                // SADLY THIS CASE NEVER HAPPENS. CRY :(

                // if (iheight <= lobe/2-1) {
                // D1 = D0;
                //
                // // combine Dyy
                // Dyy = D0 - 3 * D1;
                // Dyy *= inv_area;
                //
                // for (i = 0; i < height * step; i += step) {
                //
                //     for (j = 0; j < width * step; j += step) {
                //         // Image coordinates
                //         x = i;
                //         y = j;
                //
                //         // Calculate Dxx, Dyy, Dxy with Box Filter
                //         Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                //                 - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                //         Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                //                 + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                //                 - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                //                 - box_integral(iimage, x + 1, y + 1, lobe, lobe);
                //
                //         // Normalize Responses with inverse area
                //         Dyy *= inv_area;
                //         Dxy *= inv_area;
                //
                //         // Calculate Determinant
                //         response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;
                //
                //         // Calculate Laplacian
                //         laplacian[ind] = Dxx + Dyy >= 0;
                //         ind += 1;
                //     }
                // }

                // 2. Case
                // Only for - image_size: 32, filter_size: 99
                // inner D is in last col but the inner part is not too big
                // col is irrelevant, B and D have always the same value
                // i.e. inner loop is irrelevant for coords and values

                // We divide it again in 3 parts.
                // 1. B outside, D inside
                // 2. B outside, D outside
                // 3. B inside, D outside

                // 1. Case: B outside, D inside
                for (x = 0; x < width*step-lobe/2; x += step) {
                    // negative part
                    r10 = x - lobe / 2 - 1;
                    r11 = r10 + lobe;  // TODO fixer

                    D1 = data[r11 * data_width + (iwidth-1)];

                    // Compute Dyy
                    Dyy = D0 - 3 * D1;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 2. Case: B outside, D outside
                Dyy = - 2 * D0;
                Dyy *= inv_area;

                for (; x < lobe/2+1; x += step) {

                    for (y = 0; y < width*step; y += step) {

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 3. Case: B inside, D outside
                for (; x < height * step; x += step) {

                    r10 = x - lobe / 2 - 1;

                    B = data[r10 * data_width + (iwidth-1)];
                    // D1 = D0 - B;
                    // Dyy = D0 - 3 * D1;
                    // Dyy *= inv_area;

                    // this can be simplified to:
                    // (small difference in original is this but error is <0.000001 eps)
                    Dyy = 3*B - 2*D0;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

            } else {
                /* 2.2.b Half the filter is longer than the image, but narrower.
                // HERE: width > lobe and height <= border
                // Here only the whole filter is optimized, not negative part

                // Only happens for filter: 75 and image: 32

                // A, B = 0
                // D is outside (i.e. below) the image, but the columns change.
                // => D = [height-1, some_column]
                // C = 0 or [height-1, some_column]
                */

                // Create array for Dyy that has image width length
                // all rows (for big part) have same Dyy values
                float Dyy_arr[iwidth];  // stack is faster than heap

                // C = 0 and D = [height-1, some_column]
                // from y = 0 until D is (exclusive) in last column
                for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
                    // C = 0
                    // D = [height-1, i+lobe-1]
                    D = data[(iheight-1) * data_width + (i+lobe-1)];
                    Dyy_arr[i] = D;
                }

                // only bottom left corner value needed
                D = data[(iheight-1) * data_width + (iwidth-1)];

                // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
                // C is still outside and D now too
                for (; i < lobe; i += step) {  // 7 - 25
                    Dyy_arr[i] = D;
                }

                // if y = lobe, then C = [height-1, 0]
                // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
                for (; i < width*step; i += step) {  // 25 - 32
                    // C = [height-1, i-lobe]
                    // D = [height-1, width-1]
                    C = data[(iheight-1) * data_width + (i-lobe)];
                    Dyy_arr[i] = D - C;
                }

                // Use precomputation for faster compute
                for (x = 0; x < height*step; x += step) {

                    for (y = 0; y < width*step; y += step) {

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dyy = Dyy_arr[y] - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
                        Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dyy *= inv_area;
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;

                        // Increment index
                        ind += 1;
                    }
                }
            }
        }
    }
}